

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

void __thiscall storage::write_block(storage *this,block *b)

{
  size_t sVar1;
  
  fseek((FILE *)this->m_file,0,2);
  sVar1 = fwrite(b,1,8,(FILE *)this->m_file);
  if (sVar1 != 8) {
    __assert_fail("std::fwrite(&b.idx, 1, sizeof(b.idx), m_file) == sizeof(b.idx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                  ,0xd3,"void storage::write_block(const block &)");
  }
  sVar1 = fwrite(&b->timestamp,1,8,(FILE *)this->m_file);
  if (sVar1 == 8) {
    write_string(this,&b->prevsha256);
    write_string(this,&b->data);
    write_string(this,&b->sha256);
    return;
  }
  __assert_fail("std::fwrite(&b.timestamp, 1, sizeof(b.timestamp), m_file) == sizeof(b.timestamp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/niXman[P]blockchain/storage.hpp"
                ,0xd4,"void storage::write_block(const block &)");
}

Assistant:

void write_block(const block &b) {
        seek_to_end();

        assert(std::fwrite(&b.idx, 1, sizeof(b.idx), m_file) == sizeof(b.idx));
        assert(std::fwrite(&b.timestamp, 1, sizeof(b.timestamp), m_file) == sizeof(b.timestamp));
        write_string(b.prevsha256);
        write_string(b.data);
        write_string(b.sha256);
    }